

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

IVec4 __thiscall
deqp::gles31::Functional::anon_unknown_1::getViewportBoundingBoxArea
          (anon_unknown_1 *this,ProjectedBBox *bbox,IVec2 *viewportSize,float size)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 extraout_RDX;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  IVec4 IVar8;
  Vec4 vertexBox;
  Vector<float,_4> local_28;
  
  tcu::Vector<float,_4>::Vector(&local_28);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)this);
  fVar7 = size * 0.5;
  fVar3 = (float)(int)*(undefined8 *)viewportSize->m_data;
  fVar6 = (float)(int)((ulong)*(undefined8 *)viewportSize->m_data >> 0x20);
  uVar1 = *(undefined8 *)(bbox->min).m_data;
  uVar2 = *(undefined8 *)(bbox->max).m_data;
  fVar4 = floorf(((float)((ulong)uVar1 >> 0x20) * 0.5 + 0.5) * fVar6 - fVar7);
  fVar5 = floorf(((float)uVar1 * 0.5 + 0.5) * fVar3 - fVar7);
  fVar6 = ceilf(fVar7 + ((float)((ulong)uVar2 >> 0x20) * 0.5 + 0.5) * fVar6);
  fVar3 = ceilf(fVar7 + ((float)uVar2 * 0.5 + 0.5) * fVar3);
  *(int *)this = (int)fVar5;
  *(int *)(this + 4) = (int)fVar4;
  *(int *)(this + 8) = (int)fVar3;
  *(int *)(this + 0xc) = (int)fVar6;
  IVar8.m_data[2] = (int)extraout_RDX;
  IVar8.m_data[3] = (int)((ulong)extraout_RDX >> 0x20);
  IVar8.m_data._0_8_ = this;
  return (IVec4)IVar8.m_data;
}

Assistant:

static tcu::IVec4 getViewportBoundingBoxArea (const ProjectedBBox& bbox, const tcu::IVec2& viewportSize, float size = 0.0f)
{
	tcu::Vec4	vertexBox;
	tcu::IVec4	pixelBox;

	vertexBox.x() = (bbox.min.x() * 0.5f + 0.5f) * (float)viewportSize.x();
	vertexBox.y() = (bbox.min.y() * 0.5f + 0.5f) * (float)viewportSize.y();
	vertexBox.z() = (bbox.max.x() * 0.5f + 0.5f) * (float)viewportSize.x();
	vertexBox.w() = (bbox.max.y() * 0.5f + 0.5f) * (float)viewportSize.y();

	pixelBox.x() = deFloorFloatToInt32(vertexBox.x() - size/2.0f);
	pixelBox.y() = deFloorFloatToInt32(vertexBox.y() - size/2.0f);
	pixelBox.z() = deCeilFloatToInt32(vertexBox.z() + size/2.0f);
	pixelBox.w() = deCeilFloatToInt32(vertexBox.w() + size/2.0f);
	return pixelBox;
}